

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O0

asn_strtol_result_e asn_strtol_lim(char *str,char **end,long *lp)

{
  int iVar1;
  int d;
  long last_digit_max;
  long upper_boundary;
  long l;
  int sign;
  long *lp_local;
  char **end_local;
  char *str_local;
  
  sign = 1;
  last_digit_max = 7;
  if (*end <= str) {
    return ASN_STRTOL_ERROR_INVAL;
  }
  if (*str != '+') {
    str_local = str;
    if (*str != '-') goto LAB_00151868;
    last_digit_max = 8;
    sign = -1;
  }
  str_local = str + 1;
  if (*end <= str_local) {
    *end = str_local;
    return ASN_STRTOL_EXPECT_MORE;
  }
LAB_00151868:
  l = 0;
  do {
    if (*end <= str_local) {
      *end = str_local;
      *lp = sign * l;
      return ASN_STRTOL_OK;
    }
    if (9 < (int)*str_local - 0x30U) {
      *end = str_local;
      *lp = sign * l;
      return ASN_STRTOL_EXTRA_DATA;
    }
    iVar1 = *str_local + -0x30;
    if (l < 0xccccccccccccccc) {
      l = l * 10 + (long)iVar1;
    }
    else {
      if (l != 0xccccccccccccccc) {
        *end = str_local;
        return ASN_STRTOL_ERROR_RANGE;
      }
      if (last_digit_max < iVar1) {
        *end = str_local;
        return ASN_STRTOL_ERROR_RANGE;
      }
      if (sign < 1) {
        sign = 1;
        l = -0x7ffffffffffffff8 - (long)iVar1;
      }
      else {
        l = (long)iVar1 + 0x7ffffffffffffff8;
      }
    }
    str_local = str_local + 1;
  } while( true );
}

Assistant:

enum asn_strtol_result_e
asn_strtol_lim(const char *str, const char **end, long *lp) {
	int sign = 1;
	long l;

	const long upper_boundary = LONG_MAX / 10;
	long last_digit_max = LONG_MAX % 10;

	if(str >= *end) return ASN_STRTOL_ERROR_INVAL;

	switch(*str) {
	case '-':
		last_digit_max++;
		sign = -1;
		/* FALL THROUGH */
	case '+':
		str++;
		if(str >= *end) {
			*end = str;
			return ASN_STRTOL_EXPECT_MORE;
		}
	}

	for(l = 0; str < (*end); str++) {
		switch(*str) {
		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34:
		case 0x35: case 0x36: case 0x37: case 0x38: case 0x39: {
			int d = *str - '0';
			if(l < upper_boundary) {
				l = l * 10 + d;
			} else if(l == upper_boundary) {
				if(d <= last_digit_max) {
					if(sign > 0) {
						l = l * 10 + d;
					} else {
						sign = 1;
						l = -l * 10 - d;
					}
				} else {
					*end = str;
					return ASN_STRTOL_ERROR_RANGE;
				}
			} else {
				*end = str;
				return ASN_STRTOL_ERROR_RANGE;
			}
		    }
		    continue;
		default:
		    *end = str;
		    *lp = sign * l;
		    return ASN_STRTOL_EXTRA_DATA;
		}
	}

	*end = str;
	*lp = sign * l;
	return ASN_STRTOL_OK;
}